

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::failure(StdOutput *this,CmdLineInterface *_cmd,ArgException *e)

{
  byte bVar1;
  string *psVar2;
  ostream *poVar3;
  ostream *poVar4;
  ExitException *this_00;
  string local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [56];
  string progName;
  ArgException *e_local;
  CmdLineInterface *_cmd_local;
  StdOutput *this_local;
  
  psVar2 = (string *)(**(code **)(*(long *)_cmd + 0x50))();
  std::__cxx11::string::string((string *)(local_70 + 0x30),psVar2);
  poVar3 = std::operator<<((ostream *)&std::cerr,"PARSE ERROR: ");
  ArgException::argId_abi_cxx11_((ArgException *)local_70);
  poVar3 = std::operator<<(poVar3,(string *)local_70);
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"             ");
  ArgException::error_abi_cxx11_((ArgException *)local_90);
  poVar3 = std::operator<<(poVar3,(string *)local_90);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_70);
  bVar1 = (**(code **)(*(long *)_cmd + 0x78))();
  if ((bVar1 & 1) == 0) {
    (**(code **)((long)*this + 0x10))(this,_cmd);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Brief USAGE: ");
    std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    _shortUsage(this,_cmd,(ostream *)&std::cerr);
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"For complete USAGE and HELP type: ");
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = std::operator<<(poVar3,(string *)(local_70 + 0x30));
    poVar3 = std::operator<<(poVar3," ");
    Arg::nameStartString_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_b0);
    poVar3 = std::operator<<(poVar3,"help");
    poVar4 = (ostream *)
             std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_b0);
  }
  this_00 = (ExitException *)__cxa_allocate_exception(4);
  ExitException::ExitException(this_00,1);
  __cxa_throw(this_00,&ExitException::typeinfo,0);
}

Assistant:

inline void StdOutput::failure( CmdLineInterface& _cmd,
								ArgException& e ) 
{
	std::string progName = _cmd.getProgramName();

	std::cerr << "PARSE ERROR: " << e.argId() << std::endl
		      << "             " << e.error() << std::endl << std::endl;

	if ( _cmd.hasHelpAndVersion() )
		{
			std::cerr << "Brief USAGE: " << std::endl;

			_shortUsage( _cmd, std::cerr );	

			std::cerr << std::endl << "For complete USAGE and HELP type: " 
					  << std::endl << "   " << progName << " "
					  << Arg::nameStartString() << "help"
					  << std::endl << std::endl;
		}
	else
		usage(_cmd);

	throw ExitException(1);
}